

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPtIsOnLocus.cpp
# Opt level: O0

bool ParseTestPtIsOnLocus(string *sString)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  syntax_option_type __f;
  uint uVar4;
  uint uVar5;
  value_type *pvVar6;
  char *pcVar7;
  ostream *poVar8;
  undefined1 local_e18 [4];
  int bResult;
  LLPoint llProjPt;
  string local_de8;
  undefined1 local_dc8 [8];
  LLPoint llTestPt;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  undefined1 local_cb8 [8];
  Locus locus;
  regex_error *e;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_c30;
  string_type local_ba8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_b88;
  string_type local_b00;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_ae0;
  string_type local_a58;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_a38;
  string_type local_9b0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_990;
  string_type local_908;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_8e8;
  string_type local_860;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_840;
  string_type local_7b8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_798;
  string_type local_710;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_6f0;
  string_type local_668;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_648;
  string_type local_5c0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_5a0;
  string_type local_518;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_4f8;
  string_type local_470;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_450;
  string_type local_3c8;
  undefined1 local_3a8 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  undefined1 local_300 [8];
  sregex_token_iterator it;
  int sub_matches [14];
  regex pat;
  undefined1 local_218 [8];
  string sRxPat;
  string local_1e0 [4];
  syntax_option_type flags;
  string soResult;
  string soTestPtLong;
  string soTestPtLat;
  string soLocEndDist;
  string soLocStartDist;
  string soLocEndLong;
  string soLocEndLat;
  string soLocStartLong;
  string soLocStartLat;
  string soGeodesicEndLong;
  string soGeodesicEndLat;
  string soGeodesicStartLong;
  string soGeodesicStartLat;
  string soTestId;
  bool bPassed;
  string *sString_local;
  
  trim(sString," \t\n\r\f\v");
  std::__cxx11::string::string((string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soGeodesicStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soGeodesicEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soGeodesicEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soLocStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soLocStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soLocEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soLocEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soLocStartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soLocEndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soTestPtLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soTestPtLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soResult.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1e0);
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_218,"([a-zA-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=
            ((string *)local_218,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_218,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_218,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_218,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_218,"([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=
            ((string *)local_218,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=((string *)local_218,"([0-1])");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(sub_matches + 0xc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,__f);
  sub_matches[6] = 9;
  sub_matches[7] = 10;
  sub_matches[8] = 0xb;
  sub_matches[9] = 0xc;
  sub_matches[2] = 5;
  sub_matches[3] = 6;
  sub_matches[4] = 7;
  sub_matches[5] = 8;
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  sub_matches[0] = 3;
  sub_matches[1] = 4;
  sub_matches[10] = 0xd;
  sub_matches[0xb] = 0xe;
  local_310._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_308,&local_310);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_318,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<14ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_300,local_308,local_318,(regex_type *)(sub_matches + 0xc),
             (int (*) [14])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_3a8);
  bVar3 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_300,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_3a8);
  if (bVar3) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_450,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_450);
    std::__cxx11::sub_match::operator_cast_to_string(&local_3c8,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicStartLat.field_2._M_local_buf + 8),(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_450);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_4f8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_4f8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_470,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicStartLong.field_2._M_local_buf + 8),(string *)&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_4f8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_5a0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_5a0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_518,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicEndLat.field_2._M_local_buf + 8),(string *)&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_5a0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_648,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_648);
    std::__cxx11::sub_match::operator_cast_to_string(&local_5c0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicEndLong.field_2._M_local_buf + 8),(string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_648);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_6f0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_6f0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_668,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soLocStartLat.field_2._M_local_buf + 8),(string *)&local_668);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_6f0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_798,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_798);
    std::__cxx11::sub_match::operator_cast_to_string(&local_710,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soLocStartLong.field_2._M_local_buf + 8),(string *)&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_798);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_840,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_840);
    std::__cxx11::sub_match::operator_cast_to_string(&local_7b8,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soLocEndLat.field_2._M_local_buf + 8),(string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_840);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_8e8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_8e8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_860,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soLocEndLong.field_2._M_local_buf + 8),(string *)&local_860);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_8e8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_990,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_990);
    std::__cxx11::sub_match::operator_cast_to_string(&local_908,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soLocStartDist.field_2._M_local_buf + 8),(string *)&local_908);
    std::__cxx11::string::~string((string *)&local_908);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_990);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_a38,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_a38);
    std::__cxx11::sub_match::operator_cast_to_string(&local_9b0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soLocEndDist.field_2._M_local_buf + 8),(string *)&local_9b0);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_a38);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_ae0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_ae0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_a58,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soTestPtLat.field_2._M_local_buf + 8),(string *)&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_ae0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_b88,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_b88);
    std::__cxx11::sub_match::operator_cast_to_string(&local_b00,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soTestPtLong.field_2._M_local_buf + 8),(string *)&local_b00);
    std::__cxx11::string::~string((string *)&local_b00);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_b88);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_c30,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_300,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_c30);
    std::__cxx11::sub_match::operator_cast_to_string(&local_ba8,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(soResult.field_2._M_local_buf + 8),(string *)&local_ba8);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_c30);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_300);
    std::__cxx11::sub_match::operator_cast_to_string((string_type *)&e,(sub_match *)pvVar6);
    std::__cxx11::string::operator=(local_1e0,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_3a8);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_300);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(sub_matches + 0xc));
  std::__cxx11::string::~string((string *)local_218);
  GeoCalcs::LOCUS::LOCUS((LOCUS *)local_cb8);
  std::__cxx11::string::string
            ((string *)&local_cd8,(string *)(soGeodesicStartLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_cd8);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&local_cf8,(string *)(soGeodesicEndLat.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude(&local_cf8);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::Set((LLPOINT *)local_cb8,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&local_cf8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::__cxx11::string::string
            ((string *)&local_d18,(string *)(soGeodesicEndLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_d18);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&local_d38,(string *)(soLocStartLat.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude(&local_d38);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::Set((LLPOINT *)&locus.geoStart.longitude,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&local_d38);
  std::__cxx11::string::~string((string *)&local_d18);
  std::__cxx11::string::string
            ((string *)&local_d58,(string *)(soLocStartLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_d58);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&local_d78,(string *)(soLocEndLat.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude(&local_d78);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::Set((LLPOINT *)&locus.geoEnd.longitude,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d58);
  std::__cxx11::string::string
            ((string *)&local_d98,(string *)(soLocEndLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_d98);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&llTestPt.longitude,(string *)(soLocStartDist.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&llTestPt.longitude);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::Set((LLPOINT *)&locus.locusStart.longitude,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&llTestPt.longitude);
  std::__cxx11::string::~string((string *)&local_d98);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar7);
  locus.locusEnd.longitude = NmToMeters(dVar1);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar7);
  locus.startDist = NmToMeters(dVar1);
  locus.endDist._0_4_ = 0;
  std::__cxx11::string::string
            ((string *)&local_de8,(string *)(soTestPtLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_de8);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&llProjPt.longitude,(string *)(soResult.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&llProjPt.longitude);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_dc8,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&llProjPt.longitude);
  std::__cxx11::string::~string((string *)&local_de8);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_e18);
  bVar3 = GeoCalcs::PtIsOnLocus((Locus *)local_cb8,(LLPoint *)local_dc8,(LLPoint *)local_e18,0.001);
  uVar4 = (uint)bVar3;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  uVar5 = atoi(pcVar7);
  if (uVar4 != uVar5) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n");
    poVar8 = std::operator<<(poVar8,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8," failed: expected result of ");
    poVar8 = std::operator<<(poVar8,local_1e0);
    poVar8 = std::operator<<(poVar8,"  cacled: ");
    std::ostream::operator<<(poVar8,uVar4);
  }
  soTestId.field_2._M_local_buf[0xf] = uVar4 == uVar5;
  locus._84_4_ = 1;
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)(soResult.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soTestPtLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soTestPtLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soLocEndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soLocStartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soLocEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soLocEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soLocStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soLocStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
  return (bool)soTestId.field_2._M_local_buf[0xf];
}

Assistant:

bool ParseTestPtIsOnLocus(string sString)
{
    bool bPassed = true;
    trim(sString);
    string soTestId, soGeodesicStartLat, soGeodesicStartLong, soGeodesicEndLat, soGeodesicEndLong, soLocStartLat, soLocStartLong;
    string soLocEndLat, soLocEndLong, soLocStartDist, soLocEndDist, soTestPtLat, soTestPtLong, soResult;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-1])";
        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            soTestId = *it++;
            soGeodesicStartLat = *it++;
            soGeodesicStartLong = *it++;
            soGeodesicEndLat = *it++;
            soGeodesicEndLong = *it++;
            soLocStartLat = *it++;
            soLocStartLong = *it++;
            soLocEndLat = *it++;
            soLocEndLong = *it++;
            soLocStartDist = *it++;
            soLocEndDist = *it++;
            soTestPtLat = *it++;
            soTestPtLong = *it++;
            soResult = *it;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    Locus locus;
    locus.geoStart.Set(Deg2Rad(ParseLatitude(soGeodesicStartLat)), Deg2Rad(ParseLongitude(soGeodesicStartLong)));
    locus.geoEnd.Set(Deg2Rad(ParseLatitude(soGeodesicEndLat)), Deg2Rad(ParseLongitude(soGeodesicEndLong)));
    locus.locusStart.Set(Deg2Rad(ParseLatitude(soLocStartLat)), Deg2Rad(ParseLongitude(soLocStartLong)));
    locus.locusEnd.Set(Deg2Rad(ParseLatitude(soLocEndLat)), Deg2Rad(ParseLongitude(soLocEndLong)));
    locus.startDist = NmToMeters(atof(soLocStartDist.c_str()));
    locus.endDist = NmToMeters(atof(soLocEndDist.c_str()));
    locus.lineType = 0;

    LLPoint llTestPt(LLPoint(Deg2Rad(ParseLatitude(soTestPtLat)), Deg2Rad(ParseLongitude(soTestPtLong))));
    LLPoint llProjPt;

    // Using a low 1e-3 tolerance value (0.5 mm) to test if point is on locus
    // Tests show this to be the lowest tolerance can be set and pass the
    // 8260.54A test results page.  If values had been computed internal
    // in doubles then 1e-8 could have easily been used.
    int bResult = PtIsOnLocus(locus, llTestPt, llProjPt, 1e-3);
    if (bResult != atoi(soResult.c_str()))
    {
        cout << "\n" << soTestId << " failed: expected result of " << soResult << "  cacled: " << bResult;
        bPassed = false;
    }
    return bPassed;
}